

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_shield_cleave(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  CHAR_DATA *this;
  CClass *this_00;
  OBJ_DATA *obj;
  char *pcVar3;
  CHAR_DATA *in_RDI;
  bool bVar4;
  CHAR_DATA *victim;
  bool using_primary;
  OBJ_DATA *shield;
  OBJ_DATA *weapon;
  int chance;
  char arg [4608];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  CHAR_DATA *looker;
  undefined4 in_stack_ffffffffffffdbb8;
  int in_stack_ffffffffffffdbbc;
  OBJ_DATA *local_2428;
  int local_241c;
  char local_2418;
  int in_stack_ffffffffffffdc84;
  undefined1 in_stack_ffffffffffffdc8b;
  int in_stack_ffffffffffffdc8c;
  CHAR_DATA *in_stack_ffffffffffffdc90;
  int in_stack_ffffffffffffdcac;
  CHAR_DATA *in_stack_ffffffffffffdcb0;
  int in_stack_ffffffffffffddd4;
  CHAR_DATA *in_stack_ffffffffffffddd8;
  CHAR_DATA *in_stack_ffffffffffffdde0;
  char *in_stack_ffffffffffffedb0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  CHAR_DATA local_1218 [5];
  CHAR_DATA *local_8;
  
  local_8 = in_RDI;
  one_argument(in_stack_ffffffffffffdbb0,(char *)in_stack_ffffffffffffdba8);
  if (local_2418 == '\0') {
    this = local_8->fighting;
  }
  else {
    this = get_char_room(in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0);
  }
  iVar1 = get_skill(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
  if (iVar1 != 0) {
    in_stack_ffffffffffffdbbc = (int)local_8->level;
    looker = (CHAR_DATA *)(skill_table + gsn_shield_cleave);
    this_00 = char_data::Class(this);
    iVar2 = CClass::GetIndex(this_00);
    if (*(short *)((long)&looker->next_in_room + (long)iVar2 * 2) <= in_stack_ffffffffffffdbbc) {
      local_2428 = get_eq_char(local_8,0x10);
      bVar4 = local_2428 == (OBJ_DATA *)0x0;
      if (bVar4) {
        local_2428 = get_eq_char(local_8,0x12);
      }
      if ((local_2428 == (OBJ_DATA *)0x0) ||
         ((local_2428->value[0] != 1 && (local_2428->value[0] != 5)))) {
        send_to_char((char *)this,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
        return;
      }
      if (this == (CHAR_DATA *)0x0) {
        send_to_char((char *)0x0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
        return;
      }
      if (this == local_8) {
        send_to_char((char *)this,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
        return;
      }
      obj = get_eq_char(this,0xb);
      if (obj == (OBJ_DATA *)0x0) {
        send_to_char((char *)this,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
        return;
      }
      local_241c = (((int)local_8->level - (int)this->level) * 3 + (iVar1 * 9) / 10) -
                   (int)obj->level;
      if (bVar4) {
        local_241c = local_241c + -0xf;
      }
      bVar4 = is_npc(in_stack_ffffffffffffdba8);
      if ((!bVar4) && (local_8->fighting != this)) {
        in_stack_ffffffffffffdba8 = local_1218;
        pcVar3 = pers((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                      looker);
        sprintf((char *)in_stack_ffffffffffffdba8,"Help! %s just shield cleaved me!",pcVar3);
        do_myell(this,(char *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),looker);
      }
      bVar4 = is_obj_stat((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
                          (int)((ulong)looker >> 0x20));
      if (bVar4) {
        local_241c = 0;
      }
      iVar1 = number_percent();
      if (local_241c < iVar1) {
        act((char *)this,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
            looker,in_stack_ffffffffffffdba8,0);
        act((char *)this,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
            looker,in_stack_ffffffffffffdba8,0);
        act((char *)this,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
            looker,in_stack_ffffffffffffdba8,0);
        check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                      (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
        WAIT_STATE(this,in_stack_ffffffffffffdbbc);
        multi_hit(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8,in_stack_ffffffffffffddd4);
        return;
      }
      act((char *)this,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
          looker,in_stack_ffffffffffffdba8,0);
      act((char *)this,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
          looker,in_stack_ffffffffffffdba8,0);
      act((char *)this,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8),
          looker,in_stack_ffffffffffffdba8,0);
      extract_obj(obj);
      WAIT_STATE(this,in_stack_ffffffffffffdbbc);
      check_improve(in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c,
                    (bool)in_stack_ffffffffffffdc8b,in_stack_ffffffffffffdc84);
      multi_hit(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8,in_stack_ffffffffffffddd4);
      return;
    }
  }
  send_to_char((char *)this,
               (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbbc,in_stack_ffffffffffffdbb8));
  return;
}

Assistant:

void do_shield_cleave(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	int chance;
	OBJ_DATA *weapon;
	OBJ_DATA *shield;
	bool using_primary = true;
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	chance = get_skill(ch, gsn_shield_cleave);

	if (chance == 0 || ch->level < skill_table[gsn_shield_cleave].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know the methods to cleave a shield in two.\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr)
	{
		weapon = get_eq_char(ch, WEAR_DUAL_WIELD);
		using_primary = false;
	}

	if (weapon == nullptr || (weapon->value[0] != WEAPON_SWORD && weapon->value[0] != WEAPON_AXE))
	{
		send_to_char("You must be wielding an axe or sword to shield cleave.\n\r", ch);
		return;
	}

	if (victim == nullptr)
	{
		send_to_char("But they aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That isn't possible.\n\r", ch);
		return;
	}

	shield = get_eq_char(victim, WEAR_SHIELD);

	if (shield == nullptr)
	{
		send_to_char("But they aren't using a shield.\n\r", ch);
		return;
	}

	chance *= 9;
	chance /= 10;
	chance += (ch->level - victim->level) * 3;
	chance -= shield->level;

	if (!using_primary)
		chance -= 15;

	if (!is_npc(victim) && ch->fighting != victim)
	{
		sprintf(buf, "Help! %s just shield cleaved me!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (is_obj_stat(shield, ITEM_NODISARM))
		chance = 0;

	if (number_percent() > chance)
	{
		act("$n makes a might blow at $N's shield but fails to cleave it.", ch, 0, victim, TO_NOTVICT);
		act("$n lands a mighty blow to your shield but fails to cleave it.", ch, 0, victim, TO_VICT);
		act("You strike a mighty blow to $N's shield but fail to cleave it.", ch, 0, victim, TO_CHAR);
		check_improve(ch, gsn_shield_cleave, false, 1);

		WAIT_STATE(ch, 12);
		multi_hit(victim, ch, -1);
		return;
	}

	act("$n's mighty blow cleaves $N's shield in half!", ch, 0, victim, TO_NOTVICT);
	act("Your mighty blow cleaves $N's shield in half!", ch, 0, victim, TO_CHAR);
	act("$n strikes your shield with powerful force, cleaving it in two!", ch, 0, victim, TO_VICT);
	extract_obj(shield);

	WAIT_STATE(ch, 12);

	check_improve(ch, gsn_shield_cleave, true, 1);
	multi_hit(victim, ch, -1);
}